

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjDump(SyBlob *pOut,jx9_value *pObj)

{
  sxu32 nSize;
  char *zSrc;
  SyBlob *pContents;
  jx9_hashmap *pMap;
  char *zType;
  sxi32 rc;
  jx9_value *pObj_local;
  SyBlob *pOut_local;
  
  zType._4_4_ = 0;
  zSrc = jx9MemObjTypeDump(pObj);
  nSize = SyStrlen(zSrc);
  SyBlobAppend(pOut,zSrc,nSize);
  if ((pObj->iFlags & 0x20U) == 0) {
    SyBlobAppend(pOut,"(",1);
    if ((pObj->iFlags & 0x40U) == 0) {
      if ((pObj->iFlags & 1U) == 0) {
        MemObjStringValue(pOut,pObj);
      }
      else {
        SyBlobFormat(pOut,"%u \'",(ulong)(pObj->sBlob).nByte);
        if ((pObj->sBlob).nByte != 0) {
          SyBlobAppend(pOut,(pObj->sBlob).pBlob,(pObj->sBlob).nByte);
        }
        SyBlobAppend(pOut,"\'",1);
      }
    }
    else {
      SyBlobFormat(pOut,"%u ",(ulong)*(uint *)((pObj->x).iVal + 0x2c));
      zType._4_4_ = jx9JsonSerialize(pObj,pOut);
    }
    SyBlobAppend(pOut,")",1);
  }
  SyBlobAppend(pOut,"\n",1);
  return zType._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjDump(
	SyBlob *pOut,      /* Store the dump here */
	jx9_value *pObj   /* Dump this */
	)
{
	sxi32 rc = SXRET_OK;
	const char *zType;
	/* Get value type first */
	zType = jx9MemObjTypeDump(pObj);
	SyBlobAppend(&(*pOut), zType, SyStrlen(zType));
	if((pObj->iFlags & MEMOBJ_NULL) == 0 ){
		SyBlobAppend(&(*pOut), "(", sizeof(char));
		if( pObj->iFlags & MEMOBJ_HASHMAP ){
			jx9_hashmap *pMap = (jx9_hashmap *)pObj->x.pOther;
			SyBlobFormat(pOut,"%u ",pMap->nEntry);
			/* Dump hashmap entries */
			rc = jx9JsonSerialize(pObj,pOut);
		}else{
			SyBlob *pContents = &pObj->sBlob;
			/* Get a printable representation of the contents */
			if((pObj->iFlags & MEMOBJ_STRING) == 0 ){
				MemObjStringValue(&(*pOut), &(*pObj));
			}else{
				/* Append length first */
				SyBlobFormat(&(*pOut), "%u '", SyBlobLength(&pObj->sBlob));
				if( SyBlobLength(pContents) > 0 ){
					SyBlobAppend(&(*pOut), SyBlobData(pContents), SyBlobLength(pContents));
				}
				SyBlobAppend(&(*pOut), "'", sizeof(char));
			}
		}
		SyBlobAppend(&(*pOut), ")", sizeof(char));	
	}
#ifdef __WINNT__
	SyBlobAppend(&(*pOut), "\r\n", sizeof("\r\n")-1);
#else
	SyBlobAppend(&(*pOut), "\n", sizeof(char));
#endif
	return rc;
}